

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O2

int mbedtls_net_poll(mbedtls_net_context *ctx,uint32_t rw,uint32_t timeout)

{
  uint uVar1;
  uint uVar2;
  uint __i;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint __i_1;
  timeval *__timeout;
  timeval tv;
  fd_set write_fds;
  fd_set read_fds;
  
  uVar1 = ctx->fd;
  if ((int)uVar1 < 0) {
    uVar3 = 0xffffffbb;
  }
  else {
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      read_fds.__fds_bits[lVar5] = 0;
    }
    if ((rw & 1) != 0) {
      rw = rw & 0xfffffffe;
      read_fds.__fds_bits[uVar1 >> 6] = read_fds.__fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f)
      ;
    }
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      write_fds.__fds_bits[lVar5] = 0;
    }
    if ((rw & 2) != 0) {
      rw = rw & 0xfffffffd;
      write_fds.__fds_bits[uVar1 >> 6] =
           write_fds.__fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
    }
    if (rw == 0) {
      tv.tv_sec = (ulong)timeout / 1000;
      tv.tv_usec = (__suseconds_t)((timeout % 1000) * 1000);
      __timeout = (timeval *)0x0;
      if (timeout != 0xffffffff) {
        __timeout = (timeval *)&tv;
      }
      do {
        iVar4 = select(uVar1 + 1,(fd_set *)&read_fds,(fd_set *)&write_fds,(fd_set *)0x0,__timeout);
      } while (iVar4 == 4);
      if (iVar4 < 0) {
        uVar3 = 0xffffffb9;
      }
      else {
        uVar2 = (uint)(((ulong)read_fds.__fds_bits[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0);
        uVar3 = uVar2 + 2;
        if (((ulong)write_fds.__fds_bits[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) {
          uVar3 = uVar2;
        }
      }
    }
    else {
      uVar3 = 0xffffffb7;
    }
  }
  return uVar3;
}

Assistant:

int mbedtls_net_poll( mbedtls_net_context *ctx, uint32_t rw, uint32_t timeout )
{
    int ret;
    struct timeval tv;

    fd_set read_fds;
    fd_set write_fds;

    int fd = ctx->fd;

    if( fd < 0 )
        return( MBEDTLS_ERR_NET_INVALID_CONTEXT );

#if defined(__has_feature)
#if __has_feature(memory_sanitizer)
    /* Ensure that memory sanitizers consider read_fds and write_fds as
     * initialized even on platforms such as Glibc/x86_64 where FD_ZERO
     * is implemented in assembly. */
    memset( &read_fds, 0, sizeof( read_fds ) );
    memset( &write_fds, 0, sizeof( write_fds ) );
#endif
#endif

    FD_ZERO( &read_fds );
    if( rw & MBEDTLS_NET_POLL_READ )
    {
        rw &= ~MBEDTLS_NET_POLL_READ;
        FD_SET( fd, &read_fds );
    }

    FD_ZERO( &write_fds );
    if( rw & MBEDTLS_NET_POLL_WRITE )
    {
        rw &= ~MBEDTLS_NET_POLL_WRITE;
        FD_SET( fd, &write_fds );
    }

    if( rw != 0 )
        return( MBEDTLS_ERR_NET_BAD_INPUT_DATA );

    tv.tv_sec  = timeout / 1000;
    tv.tv_usec = ( timeout % 1000 ) * 1000;

    do
    {
        ret = select( fd + 1, &read_fds, &write_fds, NULL,
                      timeout == (uint32_t) -1 ? NULL : &tv );
    }
    while( IS_EINTR( ret ) );

    if( ret < 0 )
        return( MBEDTLS_ERR_NET_POLL_FAILED );

    ret = 0;
    if( FD_ISSET( fd, &read_fds ) )
        ret |= MBEDTLS_NET_POLL_READ;
    if( FD_ISSET( fd, &write_fds ) )
        ret |= MBEDTLS_NET_POLL_WRITE;

    return( ret );
}